

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unsubtyping.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_22::Unsubtyping::run(Unsubtyping *this,Module *wasm)

{
  bool bVar1;
  PassRunner *runner;
  ReFinalize local_180;
  Module *local_18;
  Module *wasm_local;
  Unsubtyping *this_local;
  
  local_18 = wasm;
  wasm_local = (Module *)this;
  bVar1 = FeatureSet::hasGC(&wasm->features);
  if (bVar1) {
    analyzePublicTypes(this,local_18);
    Walker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>
    ::walkModule((Walker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>
                  *)&(this->
                     super_WalkerPass<wasm::ControlFlowWalker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>_>
                     ).
                     super_ControlFlowWalker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>
                 ,local_18);
    analyzeTransitiveDependencies(this);
    optimizeTypes(this,local_18);
    ReFinalize::ReFinalize(&local_180);
    runner = Pass::getPassRunner((Pass *)this);
    WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
    ::run(&local_180.
           super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
          ,runner,local_18);
    ReFinalize::~ReFinalize(&local_180);
  }
  return;
}

Assistant:

void run(Module* wasm) override {
    if (!wasm->features.hasGC()) {
      return;
    }
    analyzePublicTypes(*wasm);
    walkModule(wasm);
    analyzeTransitiveDependencies();
    optimizeTypes(*wasm);
    // Cast types may be refinable if their source and target types are no
    // longer related. TODO: Experiment with running this only after checking
    // whether it is necessary.
    ReFinalize().run(getPassRunner(), wasm);
  }